

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::Cord::CopyToArraySlowPath(Cord *this,Nonnull<char_*> dst)

{
  CordRepBtree **this_00;
  char *pcVar1;
  bool bVar2;
  Nullable<absl::cord_internal::CordRep_*> rep;
  const_pointer pvVar3;
  size_type sVar4;
  undefined1 local_178 [8];
  string_view chunk;
  ChunkIterator __end1;
  ChunkIterator __begin1;
  ChunkRange *__range1;
  string_view fragment;
  Nonnull<char_*> dst_local;
  Cord *this_local;
  
  fragment._M_str = dst;
  bVar2 = InlineRep::is_tree(&this->contents_);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range1);
    rep = InlineRep::tree(&this->contents_);
    bVar2 = GetFlatAux(rep,(Nonnull<absl::string_view_*>)&__range1);
    pcVar1 = fragment._M_str;
    if (bVar2) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&__range1);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&__range1);
      memcpy(pcVar1,pvVar3,sVar4);
    }
    else {
      __begin1.btree_reader_.navigator_.node_[0xb] = (CordRepBtree *)Chunks(this);
      this_00 = __begin1.btree_reader_.navigator_.node_ + 0xb;
      ChunkRange::begin((ChunkIterator *)(__end1.btree_reader_.navigator_.node_ + 0xb),
                        (ChunkRange *)this_00);
      ChunkRange::end((ChunkIterator *)&chunk._M_str,(ChunkRange *)this_00);
      while (bVar2 = ChunkIterator::operator!=
                               ((ChunkIterator *)(__end1.btree_reader_.navigator_.node_ + 0xb),
                                (ChunkIterator *)&chunk._M_str), bVar2) {
        _local_178 = ChunkIterator::operator*
                               ((ChunkIterator *)(__end1.btree_reader_.navigator_.node_ + 0xb));
        pcVar1 = fragment._M_str;
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_178);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_178);
        memcpy(pcVar1,pvVar3,sVar4);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_178);
        fragment._M_str = fragment._M_str + sVar4;
        ChunkIterator::operator++((ChunkIterator *)(__end1.btree_reader_.navigator_.node_ + 0xb));
      }
    }
    return;
  }
  __assert_fail("contents_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x433,"void absl::Cord::CopyToArraySlowPath(absl::Nonnull<char *>) const");
}

Assistant:

void Cord::CopyToArraySlowPath(absl::Nonnull<char*> dst) const {
  assert(contents_.is_tree());
  absl::string_view fragment;
  if (GetFlatAux(contents_.tree(), &fragment)) {
    memcpy(dst, fragment.data(), fragment.size());
    return;
  }
  for (absl::string_view chunk : Chunks()) {
    memcpy(dst, chunk.data(), chunk.size());
    dst += chunk.size();
  }
}